

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

ssize_t hwrite2(hFILE *fp,void *srcv,size_t totalbytes,size_t ncopied)

{
  char *pcVar1;
  char *pcVar2;
  ssize_t sVar3;
  int *piVar4;
  ssize_t n;
  size_t remaining;
  size_t capacity;
  ssize_t ret;
  char *src;
  size_t ncopied_local;
  size_t totalbytes_local;
  void *srcv_local;
  hFILE *fp_local;
  
  pcVar1 = fp->limit;
  pcVar2 = fp->buffer;
  n = totalbytes - ncopied;
  ret = ncopied + (long)srcv;
  fp_local = (hFILE *)flush_buffer(fp);
  if (-1 < (long)fp_local) {
    for (; (ulong)((long)pcVar1 - (long)pcVar2) <= (ulong)(n << 1); n = n - sVar3) {
      sVar3 = (*fp->backend->write)(fp,(void *)ret,n);
      if (sVar3 < 0) {
        piVar4 = __errno_location();
        fp->has_errno = *piVar4;
        return sVar3;
      }
      fp->offset = sVar3 + fp->offset;
      ret = sVar3 + ret;
    }
    memcpy(fp->begin,(void *)ret,n);
    fp->begin = fp->begin + n;
    fp_local = (hFILE *)totalbytes;
  }
  return (ssize_t)fp_local;
}

Assistant:

ssize_t hwrite2(hFILE *fp, const void *srcv, size_t totalbytes, size_t ncopied)
{
    const char *src = (const char *) srcv;
    ssize_t ret;
    const size_t capacity = fp->limit - fp->buffer;
    size_t remaining = totalbytes - ncopied;
    src += ncopied;

    ret = flush_buffer(fp);
    if (ret < 0) return ret;

    // Write large blocks out directly from the source buffer
    while (remaining * 2 >= capacity) {
        ssize_t n = fp->backend->write(fp, src, remaining);
        if (n < 0) { fp->has_errno = errno; return n; }
        fp->offset += n;
        src += n, remaining -= n;
    }

    // Just buffer any remaining characters
    memcpy(fp->begin, src, remaining);
    fp->begin += remaining;

    return totalbytes;
}